

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::unitBtranIterativeRefinement(HEkk *this,HighsInt row_out,HVector *row_ep)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  long in_RDX;
  long in_RDI;
  double correction_value;
  HighsInt iRow;
  HighsInt iEl;
  double residual_scale;
  bool debug_iterative_refinement_report;
  bool debug_iterative_refinement_report_on;
  double expected_density;
  double correction_norm;
  double residual_norm;
  HVector residual;
  HighsLp *lp;
  HVector *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  undefined8 in_stack_fffffffffffffea8;
  HighsInt size_;
  double dVar5;
  HVectorBase<double> *in_stack_fffffffffffffeb0;
  double in_stack_fffffffffffffec0;
  double local_120;
  double local_118;
  int local_110;
  int local_10c;
  double local_108;
  undefined4 local_fc;
  byte local_f6;
  undefined1 local_f5;
  undefined8 local_e8;
  double local_e0;
  double local_d8;
  uint local_cc;
  vector<int,_std::allocator<int>_> vStack_c8;
  double *in_stack_ffffffffffffff60;
  HVector *in_stack_ffffffffffffff68;
  HVector *in_stack_ffffffffffffff70;
  HighsInt in_stack_ffffffffffffff7c;
  HEkk *in_stack_ffffffffffffff80;
  
  size_ = (HighsInt)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  HVectorBase<double>::HVectorBase
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  local_d8 = 0.0;
  local_e0 = 0.0;
  local_e8 = 0x3ff0000000000000;
  HVectorBase<double>::setup(in_stack_fffffffffffffeb0,size_);
  unitBtranResidual(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                    in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  local_f5 = 0;
  local_f6 = 0;
  if ((local_d8 != 0.0) || (NAN(local_d8))) {
    local_108 = nearestPowerOfTwoScale(in_stack_fffffffffffffec0);
    for (local_10c = 0; local_10c < (int)local_cc; local_10c = local_10c + 1) {
      dVar5 = local_108;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_c8,(long)local_10c);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff50,
                          (long)*pvVar2);
      *pvVar3 = dVar5 * *pvVar3;
    }
    btran((HEkk *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
          in_stack_fffffffffffffe98,3.86835564923881e-317);
    *(undefined4 *)(in_RDX + 4) = 0;
    local_e0 = 0.0;
    for (local_110 = 0; local_110 < *(int *)(in_RDI + 0x219c); local_110 = local_110 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff50,
                          (long)local_110);
      if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff50,
                            (long)local_110);
        local_118 = *pvVar3 / local_108;
        local_120 = ABS(local_118);
        pdVar4 = std::max<double>(&local_120,&local_e0);
        local_e0 = *pdVar4;
        dVar5 = local_118;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),
                            (long)local_110);
        *pvVar3 = *pvVar3 - dVar5;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)local_110
                         );
      if (1e-14 <= ABS(*pvVar3)) {
        iVar1 = *(int *)(in_RDX + 4);
        *(int *)(in_RDX + 4) = iVar1 + 1;
        in_stack_fffffffffffffea4 = local_110;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDX + 8),(long)iVar1);
        *pvVar2 = in_stack_fffffffffffffea4;
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),
                            (long)local_110);
        *pvVar3 = 0.0;
      }
    }
    if ((local_f6 & 1) != 0) {
      printf("HEkk::unitBtranIterativeRefinement: Correction has %6d / %6d nonzeros and norm of %g\n"
             ,local_e0,(ulong)local_cc,(ulong)*(uint *)(in_RDI + 0x219c));
    }
    local_fc = 0;
  }
  else {
    local_fc = 1;
  }
  HVectorBase<double>::~HVectorBase
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  return;
}

Assistant:

void HEkk::unitBtranIterativeRefinement(const HighsInt row_out,
                                        HVector& row_ep) {
  // Perform an iteration of refinement
  HighsLp& lp = this->lp_;
  HVector residual;
  double residual_norm = 0;
  double correction_norm = 0;
  const double expected_density = 1;
  residual.setup(lp.num_row_);
  unitBtranResidual(row_out, row_ep, residual, residual_norm);
  const bool debug_iterative_refinement_report_on = false;
  bool debug_iterative_refinement_report = false;
  if (debug_iteration_report_) {
    debug_iterative_refinement_report = debug_iterative_refinement_report_on;
  }
  if (debug_iterative_refinement_report)
    printf(
        "HEkk::unitBtranIterativeRefinement: Residual   has %6d / %6d nonzeros "
        "and norm of %g\n",
        (int)residual.count, (int)lp.num_row_, residual_norm);
  if (!residual_norm) return;
  // Normalise using nearest power of 2 to ||correction_rhs|| so kHighsTiny
  // isn't used adversely
  const double residual_scale = nearestPowerOfTwoScale(residual_norm);
  for (HighsInt iEl = 0; iEl < residual.count; iEl++)
    residual.array[residual.index[iEl]] *= residual_scale;
  btran(residual, expected_density);
  row_ep.count = 0;
  correction_norm = 0;
  // Adding two (possibly sparse) vectors, so have to loop over all rows
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (residual.array[iRow]) {
      const double correction_value = residual.array[iRow] / residual_scale;
      correction_norm = max(fabs(correction_value), correction_norm);
      row_ep.array[iRow] -= correction_value;
    }
    if (fabs(row_ep.array[iRow]) < kHighsTiny) {
      row_ep.array[iRow] = 0;
    } else {
      row_ep.index[row_ep.count++] = iRow;
    }
  }
  if (debug_iterative_refinement_report)
    printf(
        "HEkk::unitBtranIterativeRefinement: Correction has %6d / %6d nonzeros "
        "and norm of %g\n",
        (int)residual.count, (int)lp.num_row_, correction_norm);
}